

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundline_intersector.h
# Opt level: O1

void __thiscall
embree::avx512::__roundline_internal::ConeGeometryIntersector<8>::ConeGeometryIntersector
          (ConeGeometryIntersector<8> *this,Vec3vf<8> *ray_org,Vec3vf<8> *ray_dir,vfloat<8> *dOdO,
          vfloat<8> *rcp_dOdO,Vec4vf<8> *a,Vec4vf<8> *b)

{
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar1;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar2;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar3;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar4;
  undefined1 auVar5 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  
  ConeGeometry<8>::ConeGeometry(&this->super_ConeGeometry<8>,a,b);
  uVar26 = *(undefined8 *)((long)&ray_org->field_0 + 8);
  uVar27 = *(undefined8 *)((long)&ray_org->field_0 + 0x10);
  uVar28 = *(undefined8 *)((long)&ray_org->field_0 + 0x18);
  *(undefined8 *)&(this->org).field_0 = *(undefined8 *)&ray_org->field_0;
  *(undefined8 *)((long)&(this->org).field_0 + 8) = uVar26;
  *(undefined8 *)((long)&(this->org).field_0 + 0x10) = uVar27;
  *(undefined8 *)((long)&(this->org).field_0 + 0x18) = uVar28;
  uVar26 = *(undefined8 *)((long)&ray_org->field_0 + 0x28);
  uVar27 = *(undefined8 *)((long)&ray_org->field_0 + 0x30);
  uVar28 = *(undefined8 *)((long)&ray_org->field_0 + 0x38);
  *(undefined8 *)((long)&(this->org).field_0 + 0x20) =
       *(undefined8 *)((long)&ray_org->field_0 + 0x20);
  *(undefined8 *)((long)&(this->org).field_0 + 0x28) = uVar26;
  *(undefined8 *)((long)&(this->org).field_0 + 0x30) = uVar27;
  *(undefined8 *)((long)&(this->org).field_0 + 0x38) = uVar28;
  uVar26 = *(undefined8 *)((long)&ray_org->field_0 + 0x48);
  uVar27 = *(undefined8 *)((long)&ray_org->field_0 + 0x50);
  uVar28 = *(undefined8 *)((long)&ray_org->field_0 + 0x58);
  *(undefined8 *)((long)&(this->org).field_0 + 0x40) =
       *(undefined8 *)((long)&ray_org->field_0 + 0x40);
  *(undefined8 *)((long)&(this->org).field_0 + 0x48) = uVar26;
  *(undefined8 *)((long)&(this->org).field_0 + 0x50) = uVar27;
  *(undefined8 *)((long)&(this->org).field_0 + 0x58) = uVar28;
  auVar5 = vsubps_avx((undefined1  [32])(ray_org->field_0).field_0.x.field_0,
                      (undefined1  [32])(this->super_ConeGeometry<8>).p0.field_0.field_0.x.field_0);
  aVar6.v = (__m256)vsubps_avx((ray_org->field_0).field_0.y.field_0,
                               (this->super_ConeGeometry<8>).p0.field_0.field_0.y.field_0);
  auVar7 = vsubps_avx((undefined1  [32])(ray_org->field_0).field_0.z.field_0,
                      (undefined1  [32])(this->super_ConeGeometry<8>).p0.field_0.field_0.z.field_0);
  *(undefined1 (*) [32])&(this->O).field_0 = auVar5;
  (this->O).field_0.field_0.y.field_0 = aVar6;
  *(undefined1 (*) [32])((long)&(this->O).field_0 + 0x40) = auVar7;
  aVar1 = (ray_dir->field_0).field_0.x.field_0;
  (this->dO).field_0.field_0.x.field_0 = aVar1;
  aVar2 = (ray_dir->field_0).field_0.y.field_0;
  (this->dO).field_0.field_0.y.field_0 = aVar2;
  fVar11 = *(float *)((long)&ray_dir->field_0 + 0x40);
  fVar12 = *(float *)((long)&ray_dir->field_0 + 0x44);
  fVar13 = *(float *)((long)&ray_dir->field_0 + 0x48);
  fVar14 = *(float *)((long)&ray_dir->field_0 + 0x4c);
  fVar15 = *(float *)((long)&ray_dir->field_0 + 0x50);
  fVar16 = *(float *)((long)&ray_dir->field_0 + 0x54);
  fVar17 = *(float *)((long)&ray_dir->field_0 + 0x58);
  uVar18 = *(undefined4 *)((long)&ray_dir->field_0 + 0x5c);
  *(float *)((long)&(this->dO).field_0 + 0x40) = fVar11;
  *(float *)((long)&(this->dO).field_0 + 0x44) = fVar12;
  *(float *)((long)&(this->dO).field_0 + 0x48) = fVar13;
  *(float *)((long)&(this->dO).field_0 + 0x4c) = fVar14;
  *(float *)((long)&(this->dO).field_0 + 0x50) = fVar15;
  *(float *)((long)&(this->dO).field_0 + 0x54) = fVar16;
  *(float *)((long)&(this->dO).field_0 + 0x58) = fVar17;
  *(undefined4 *)((long)&(this->dO).field_0 + 0x5c) = uVar18;
  uVar26 = *(undefined8 *)((long)&dOdO->field_0 + 8);
  uVar27 = *(undefined8 *)((long)&dOdO->field_0 + 0x10);
  uVar28 = *(undefined8 *)((long)&dOdO->field_0 + 0x18);
  *(undefined8 *)&(this->dOdO).field_0 = *(undefined8 *)&dOdO->field_0;
  *(undefined8 *)((long)&(this->dOdO).field_0 + 8) = uVar26;
  *(undefined8 *)((long)&(this->dOdO).field_0 + 0x10) = uVar27;
  *(undefined8 *)((long)&(this->dOdO).field_0 + 0x18) = uVar28;
  uVar26 = *(undefined8 *)((long)&rcp_dOdO->field_0 + 8);
  uVar27 = *(undefined8 *)((long)&rcp_dOdO->field_0 + 0x10);
  uVar28 = *(undefined8 *)((long)&rcp_dOdO->field_0 + 0x18);
  *(undefined8 *)&(this->rcp_dOdO).field_0 = *(undefined8 *)&rcp_dOdO->field_0;
  *(undefined8 *)((long)&(this->rcp_dOdO).field_0 + 8) = uVar26;
  *(undefined8 *)((long)&(this->rcp_dOdO).field_0 + 0x10) = uVar27;
  *(undefined8 *)((long)&(this->rcp_dOdO).field_0 + 0x18) = uVar28;
  aVar3 = (this->super_ConeGeometry<8>).dP.field_0.field_0.x.field_0;
  aVar4 = (this->super_ConeGeometry<8>).dP.field_0.field_0.y.field_0;
  fVar19 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x40);
  fVar20 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x44);
  fVar21 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x48);
  fVar22 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x4c);
  fVar23 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x50);
  fVar24 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x54);
  fVar25 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x58);
  auVar10._4_4_ = fVar20 * auVar7._4_4_;
  auVar10._0_4_ = fVar19 * auVar7._0_4_;
  auVar10._8_4_ = fVar21 * auVar7._8_4_;
  auVar10._12_4_ = fVar22 * auVar7._12_4_;
  auVar10._16_4_ = fVar23 * auVar7._16_4_;
  auVar10._20_4_ = fVar24 * auVar7._20_4_;
  auVar10._24_4_ = fVar25 * auVar7._24_4_;
  auVar10._28_4_ = auVar7._28_4_;
  auVar8 = vfmadd231ps_fma(auVar10,(undefined1  [32])aVar4,(undefined1  [32])aVar6);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),(undefined1  [32])aVar3,auVar5);
  (this->OdP).field_0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar8);
  auVar7._4_4_ = fVar20 * fVar12;
  auVar7._0_4_ = fVar19 * fVar11;
  auVar7._8_4_ = fVar21 * fVar13;
  auVar7._12_4_ = fVar22 * fVar14;
  auVar7._16_4_ = fVar23 * fVar15;
  auVar7._20_4_ = fVar24 * fVar16;
  auVar7._24_4_ = fVar25 * fVar17;
  auVar7._28_4_ = auVar5._28_4_;
  auVar9 = vfmadd231ps_fma(auVar7,(undefined1  [32])aVar4,(undefined1  [32])aVar2);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),(undefined1  [32])aVar3,(undefined1  [32])aVar1);
  (this->dOdP).field_0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar9);
  fVar11 = (this->super_ConeGeometry<8>).r0dr.field_0.v[1];
  fVar12 = (this->super_ConeGeometry<8>).r0dr.field_0.v[2];
  fVar13 = (this->super_ConeGeometry<8>).r0dr.field_0.v[3];
  fVar14 = (this->super_ConeGeometry<8>).r0dr.field_0.v[4];
  fVar15 = (this->super_ConeGeometry<8>).r0dr.field_0.v[5];
  fVar16 = (this->super_ConeGeometry<8>).r0dr.field_0.v[6];
  fVar17 = (this->super_ConeGeometry<8>).r0dr.field_0.v[7];
  (this->yp).field_0.v[0] = auVar8._0_4_ + (this->super_ConeGeometry<8>).r0dr.field_0.v[0];
  (this->yp).field_0.v[1] = auVar8._4_4_ + fVar11;
  (this->yp).field_0.v[2] = auVar8._8_4_ + fVar12;
  (this->yp).field_0.v[3] = auVar8._12_4_ + fVar13;
  (this->yp).field_0.v[4] = fVar14 + 0.0;
  (this->yp).field_0.v[5] = fVar15 + 0.0;
  (this->yp).field_0.v[6] = fVar16 + 0.0;
  (this->yp).field_0.v[7] = fVar17 + 0.0;
  return;
}

Assistant:

ConeGeometryIntersector (const Vec3vf<M>& ray_org, const Vec3vf<M>& ray_dir, const vfloat<M>& dOdO, const vfloat<M>& rcp_dOdO, const Vec4vf<M>& a, const Vec4vf<M>& b)
          : ConeGeometry<M>(a,b), org(ray_org), O(ray_org-p0), dO(ray_dir),  dOdO(dOdO), rcp_dOdO(rcp_dOdO), OdP(dot(dP,O)), dOdP(dot(dP,dO)),  yp(OdP + r0dr) {}